

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11.hpp
# Opt level: O2

void __thiscall
helics::helicsCLI11App::helicsCLI11App
          (helicsCLI11App *this,string *app_description,string *app_name)

{
  App *pAVar1;
  allocator<char> local_19b;
  allocator<char> local_19a;
  allocator<char> local_199;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string(&local_38,app_description);
  std::__cxx11::string::string((string *)&local_58,app_name);
  CLI::App::App(&this->super_App,&local_38,&local_58,(App *)0x0);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_App)._vptr_App = (_func_int **)&PTR__helicsCLI11App_004bf540;
  this->quiet = false;
  this->passConfig = true;
  *(undefined8 *)&this->last_output = 0;
  *(undefined8 *)
   ((long)&(this->cbacks).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->cbacks).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->cbacks).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->remArgs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->remArgs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->remArgs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"-h,-?,--help",(allocator<char> *)&local_178);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"Print this help message and exit",&local_19b);
  CLI::App::set_help_flag(&this->super_App,&local_78,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"--config-file,--config",(allocator<char> *)&local_178);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"helics_config.toml",&local_19b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"specify base configuration file",&local_19a);
  CLI::App::set_config(&this->super_App,&local_98,&local_b8,&local_198,false);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"--version",&local_19b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"3.6.1 (2025-02-24)",&local_19a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"Display program version information and exit",&local_199);
  CLI::App::set_version_flag(&this->super_App,&local_d8,&local_198,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"quiet",(allocator<char> *)&local_198);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"",(allocator<char> *)&local_178);
  pAVar1 = &CLI::App::add_option_group<CLI::Option_group>(&this->super_App,&local_f8,&local_118)->
            super_App;
  pAVar1 = CLI::App::immediate_callback(pAVar1,true);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"--quiet",&local_19b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"silence most print output",&local_19a);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar1,&local_138,&this->quiet,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  return;
}

Assistant:

explicit helicsCLI11App(std::string app_description = "", const std::string& app_name = ""):
        CLI::App(std::move(app_description), app_name, nullptr)
    {
        set_help_flag("-h,-?,--help", "Print this help message and exit");
        set_config("--config-file,--config",
                   "helics_config.toml",
                   "specify base configuration file");
        set_version_flag("--version", helics::versionString);
        add_option_group("quiet")->immediate_callback()->add_flag("--quiet",
                                                                  quiet,
                                                                  "silence most print output");
    }